

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DebugNodeWindow(ImGuiWindow *window,char *label)

{
  ImVec4 *pIVar1;
  ImVec4 *pIVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  ImGuiColorMod *pIVar5;
  float fVar6;
  ImGuiContext *pIVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  ImDrawList *pIVar11;
  char *pcVar12;
  char *pcVar13;
  uint uVar14;
  long lVar15;
  char *pcVar16;
  ulong uVar17;
  char *pcVar18;
  char *pcVar19;
  char *pcVar20;
  char *pcVar21;
  char *pcVar22;
  char *pcVar23;
  long lVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  undefined8 uStack_50;
  ImVec2 local_48;
  undefined8 uStack_40;
  
  if (window == (ImGuiWindow *)0x0) {
    BulletText("%s: NULL",label);
    return;
  }
  bVar10 = window->WasActive;
  uVar14 = (uint)(GImGui->NavWindow == window);
  if (bVar10 == false) {
    PushStyleColor(0,(GImGui->Style).Colors + 1);
    bVar8 = TreeNodeEx(label,uVar14,"%s \'%s\'%s",label,window->Name," *Inactive*");
    pIVar7 = GImGui;
    lVar15 = (long)(GImGui->ColorStack).Size;
    pIVar5 = (GImGui->ColorStack).Data;
    pIVar1 = &pIVar5[lVar15 + -1].BackupValue;
    fVar25 = pIVar1->y;
    fVar26 = pIVar1->z;
    fVar6 = pIVar1->w;
    pIVar2 = (GImGui->Style).Colors + pIVar5[lVar15 + -1].Col;
    pIVar2->x = pIVar1->x;
    pIVar2->y = fVar25;
    pIVar2->z = fVar26;
    pIVar2->w = fVar6;
    (pIVar7->ColorStack).Size = (pIVar7->ColorStack).Size + -1;
  }
  else {
    bVar8 = TreeNodeEx(label,uVar14,"%s \'%s\'%s",label,window->Name,"");
    bVar9 = IsItemHovered(0);
    if ((bVar9 & bVar10) == 1) {
      pIVar11 = GetViewportDrawList(*(GImGui->Viewports).Data,1,"##Foreground");
      local_68.x = (window->Size).x + (window->Pos).x;
      local_68.y = (window->Size).y + (window->Pos).y;
      ImDrawList::AddRect(pIVar11,&window->Pos,&local_68,0xff00ffff,0.0,0,1.0);
    }
  }
  if (bVar8) {
    if (window->MemoryCompacted == true) {
      TextDisabled("Note: some memory buffers have been compacted/freed.");
    }
    uVar14 = window->Flags;
    DebugNodeDrawList(window,window->DrawList,"DrawList");
    BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f) Ideal (%.1f,%.1f)",
               (double)(window->Pos).x,(double)(window->Pos).y,SUB84((double)(window->Size).x,0),
               (double)(window->Size).y,(double)(window->ContentSize).x,
               (double)(window->ContentSize).y,(double)(window->ContentSizeIdeal).x,
               (double)(window->ContentSizeIdeal).y);
    pcVar13 = "Child ";
    if ((uVar14 >> 0x18 & 1) == 0) {
      pcVar13 = "";
    }
    auVar28._0_4_ = -(uint)((uVar14 & 0x10000000) == 0);
    auVar28._4_4_ = -(uint)((uVar14 & 0x8000000) == 0);
    auVar28._8_4_ = -(uint)((uVar14 & 0x4000000) == 0);
    auVar28._12_4_ = -(uint)((uVar14 & 0x2000000) == 0);
    auVar27._0_4_ = -(uint)((uVar14 & 0x40) == 0);
    auVar27._4_4_ = -(uint)((uVar14 & 0x40000) == 0);
    auVar27._8_4_ = -(uint)((uVar14 & 0x200) == 0);
    auVar27._12_4_ = -(uint)((uVar14 & 0x100) == 0);
    auVar28 = packssdw(auVar27,auVar28);
    auVar28 = packsswb(auVar28,auVar28);
    pcVar12 = "Tooltip ";
    if ((auVar28 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar12 = "";
    }
    pcVar16 = "Popup ";
    if ((auVar28 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar16 = "";
    }
    pcVar18 = "Modal ";
    if ((auVar28 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar18 = "";
    }
    pcVar19 = "ChildMenu ";
    if ((auVar28 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar19 = "";
    }
    pcVar20 = "NoSavedSettings ";
    if ((auVar28 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar20 = "";
    }
    pcVar23 = "NoMouseInputs";
    if ((auVar28 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar23 = "";
    }
    pcVar21 = "NoNavInputs";
    if ((auVar28 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar21 = "";
    }
    pcVar22 = "AlwaysAutoResize";
    if ((auVar28 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar22 = "";
    }
    BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)",(ulong)uVar14,pcVar13,pcVar12,pcVar16,pcVar18,
               pcVar19,pcVar20,pcVar23,pcVar21,pcVar22);
    pcVar13 = "X";
    if (window->ScrollbarX == false) {
      pcVar13 = "";
    }
    pcVar12 = "Y";
    if (window->ScrollbarY == false) {
      pcVar12 = "";
    }
    BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s",(double)(window->Scroll).x,
               (double)(window->ScrollMax).x,SUB84((double)(window->Scroll).y,0),
               (double)(window->ScrollMax).y,pcVar13,pcVar12);
    if ((window->Active != false) || (uVar17 = 0xffffffff, window->WasActive != false)) {
      uVar17 = (ulong)(uint)(int)window->BeginOrderWithinContext;
    }
    BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d",(ulong)window->Active
               ,(ulong)window->WasActive,(ulong)window->WriteAccessed,uVar17);
    BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d",
               (ulong)window->Appearing,(ulong)window->Hidden,
               (ulong)(uint)(int)window->HiddenFramesCanSkipItems,
               (ulong)(uint)(int)window->HiddenFramesCannotSkipItems,(ulong)window->SkipItems);
    lVar15 = 0;
    bVar10 = true;
    do {
      bVar8 = bVar10;
      IVar3 = window->NavRectRel[lVar15].Min;
      IVar4 = window->NavRectRel[lVar15].Max;
      fVar25 = IVar4.y;
      if ((IVar3.x < fVar25) || (IVar3.y < fVar25)) {
        uStack_50 = 0;
        uStack_40 = 0;
        local_58 = IVar3;
        local_48 = IVar4;
        BulletText("NavLastIds[%d]: 0x%08X at +(%.1f,%.1f)(%.1f,%.1f)",(double)IVar3.x,
                   (double)IVar3.y,SUB84((double)IVar4.x,0),(double)fVar25,lVar15,
                   (ulong)window->NavLastIds[lVar15]);
        bVar10 = IsItemHovered(0);
        if (bVar10) {
          pIVar11 = GetViewportDrawList(*(GImGui->Viewports).Data,1,"##Foreground");
          fVar25 = (window->Pos).x;
          local_68.x = local_58.x + fVar25;
          fVar26 = (window->Pos).y;
          local_68.y = local_58.y + fVar26;
          local_60.x = local_48.x + fVar25;
          local_60.y = local_48.y + fVar26;
          ImDrawList::AddRect(pIVar11,&local_68,&local_60,0xff00ffff,0.0,0,1.0);
        }
      }
      else {
        BulletText("NavLastIds[%d]: 0x%08X",lVar15,(ulong)window->NavLastIds[lVar15]);
      }
      lVar15 = 1;
      bVar10 = false;
    } while (bVar8);
    if (window->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
      pcVar13 = "NULL";
    }
    else {
      pcVar13 = window->NavLastChildNavWindow->Name;
    }
    BulletText("NavLayersActiveMask: %X, NavLastChildNavWindow: %s",
               (ulong)(uint)(int)(window->DC).NavLayersActiveMask,pcVar13);
    if (window->RootWindow != window) {
      DebugNodeWindow(window->RootWindow,"RootWindow");
    }
    if (window->ParentWindow != (ImGuiWindow *)0x0) {
      DebugNodeWindow(window->ParentWindow,"ParentWindow");
    }
    if (0 < (window->DC).ChildWindows.Size) {
      DebugNodeWindowsList(&(window->DC).ChildWindows,"ChildWindows");
    }
    if ((0 < (window->ColumnsStorage).Size) &&
       (bVar10 = TreeNode("Columns","Columns sets (%d)"), bVar10)) {
      if (0 < (window->ColumnsStorage).Size) {
        lVar15 = 0;
        lVar24 = 0;
        do {
          DebugNodeColumns((ImGuiOldColumns *)((long)&((window->ColumnsStorage).Data)->ID + lVar15))
          ;
          lVar24 = lVar24 + 1;
          lVar15 = lVar15 + 0x88;
        } while (lVar24 < (window->ColumnsStorage).Size);
      }
      TreePop();
    }
    DebugNodeStorage(&window->StateStorage,"Storage");
    TreePop();
  }
  return;
}

Assistant:

void ImGui::DebugNodeWindow(ImGuiWindow* window, const char* label)
{
    if (window == NULL)
    {
        BulletText("%s: NULL", label);
        return;
    }

    ImGuiContext& g = *GImGui;
    const bool is_active = window->WasActive;
    ImGuiTreeNodeFlags tree_node_flags = (window == g.NavWindow) ? ImGuiTreeNodeFlags_Selected : ImGuiTreeNodeFlags_None;
    if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    const bool open = TreeNodeEx(label, tree_node_flags, "%s '%s'%s", label, window->Name, is_active ? "" : " *Inactive*");
    if (!is_active) { PopStyleColor(); }
    if (IsItemHovered() && is_active)
        GetForegroundDrawList(window)->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
    if (!open)
        return;

    if (window->MemoryCompacted)
        TextDisabled("Note: some memory buffers have been compacted/freed.");

    ImGuiWindowFlags flags = window->Flags;
    DebugNodeDrawList(window, window->DrawList, "DrawList");
    BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f) Ideal (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->ContentSize.x, window->ContentSize.y, window->ContentSizeIdeal.x, window->ContentSizeIdeal.y);
    BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
        (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
        (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
        (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
    BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s", window->Scroll.x, window->ScrollMax.x, window->Scroll.y, window->ScrollMax.y, window->ScrollbarX ? "X" : "", window->ScrollbarY ? "Y" : "");
    BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
    BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesCanSkipItems, window->HiddenFramesCannotSkipItems, window->SkipItems);
    for (int layer = 0; layer < ImGuiNavLayer_COUNT; layer++)
    {
        ImRect r = window->NavRectRel[layer];
        if (r.Min.x >= r.Max.y && r.Min.y >= r.Max.y)
        {
            BulletText("NavLastIds[%d]: 0x%08X", layer, window->NavLastIds[layer]);
            continue;
        }
        BulletText("NavLastIds[%d]: 0x%08X at +(%.1f,%.1f)(%.1f,%.1f)", layer, window->NavLastIds[layer], r.Min.x, r.Min.y, r.Max.x, r.Max.y);
        if (IsItemHovered())
            GetForegroundDrawList(window)->AddRect(r.Min + window->Pos, r.Max + window->Pos, IM_COL32(255, 255, 0, 255));
    }
    BulletText("NavLayersActiveMask: %X, NavLastChildNavWindow: %s", window->DC.NavLayersActiveMask, window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
    if (window->RootWindow != window)       { DebugNodeWindow(window->RootWindow, "RootWindow"); }
    if (window->ParentWindow != NULL)       { DebugNodeWindow(window->ParentWindow, "ParentWindow"); }
    if (window->DC.ChildWindows.Size > 0)   { DebugNodeWindowsList(&window->DC.ChildWindows, "ChildWindows"); }
    if (window->ColumnsStorage.Size > 0 && TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
    {
        for (int n = 0; n < window->ColumnsStorage.Size; n++)
            DebugNodeColumns(&window->ColumnsStorage[n]);
        TreePop();
    }
    DebugNodeStorage(&window->StateStorage, "Storage");
    TreePop();
}